

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_reader_init_mem(mz_zip_archive *pZip,void *pMem,size_t size,mz_uint32 flags)

{
  mz_bool mVar1;
  mz_uint32 flags_local;
  size_t size_local;
  void *pMem_local;
  mz_zip_archive *pZip_local;
  
  mVar1 = (anonymous_namespace)::miniz::mz_zip_reader_init_internal(pZip,flags);
  if (mVar1 == 0) {
    pZip_local._4_4_ = 0;
  }
  else {
    pZip->m_archive_size = size;
    pZip->m_pRead = (anonymous_namespace)::miniz::mz_zip_mem_read_func;
    pZip->m_pIO_opaque = pZip;
    pZip->m_pState->m_pMem = pMem;
    pZip->m_pState->m_mem_size = size;
    mVar1 = (anonymous_namespace)::miniz::mz_zip_reader_read_central_dir(pZip,flags);
    if (mVar1 == 0) {
      mz_zip_reader_end(pZip);
      pZip_local._4_4_ = 0;
    }
    else {
      pZip_local._4_4_ = 1;
    }
  }
  return pZip_local._4_4_;
}

Assistant:

mz_bool mz_zip_reader_init_mem(mz_zip_archive *pZip, const void *pMem,
                               size_t size, mz_uint32 flags) {
  if (!mz_zip_reader_init_internal(pZip, flags))
    return MZ_FALSE;
  pZip->m_archive_size = size;
  pZip->m_pRead = mz_zip_mem_read_func;
  pZip->m_pIO_opaque = pZip;
#ifdef __cplusplus
  pZip->m_pState->m_pMem = const_cast<void *>(pMem);
#else
  pZip->m_pState->m_pMem = (void *)pMem;
#endif
  pZip->m_pState->m_mem_size = size;
  if (!mz_zip_reader_read_central_dir(pZip, flags)) {
    mz_zip_reader_end(pZip);
    return MZ_FALSE;
  }
  return MZ_TRUE;
}